

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void set_inter_tx_size(MB_MODE_INFO *mbmi,int stride_log2,int tx_w_log2,int tx_h_log2,int min_txs,
                      int split_size,int txs,int blk_row,int blk_col)

{
  int index;
  int idx;
  int idy;
  int split_size_local;
  int min_txs_local;
  int tx_h_log2_local;
  int tx_w_log2_local;
  int stride_log2_local;
  MB_MODE_INFO *mbmi_local;
  
  for (idy = 0; idy < tx_size_high_unit[split_size]; idy = tx_size_high_unit[min_txs] + idy) {
    for (idx = 0; idx < tx_size_wide_unit[split_size]; idx = tx_size_wide_unit[min_txs] + idx) {
      mbmi->inter_tx_size
      [((blk_row + idy >> ((byte)tx_h_log2 & 0x1f)) << ((byte)stride_log2 & 0x1f)) +
       (blk_col + idx >> ((byte)tx_w_log2 & 0x1f))] = (TX_SIZE)txs;
    }
  }
  return;
}

Assistant:

static inline void set_inter_tx_size(MB_MODE_INFO *mbmi, int stride_log2,
                                     int tx_w_log2, int tx_h_log2, int min_txs,
                                     int split_size, int txs, int blk_row,
                                     int blk_col) {
  for (int idy = 0; idy < tx_size_high_unit[split_size];
       idy += tx_size_high_unit[min_txs]) {
    for (int idx = 0; idx < tx_size_wide_unit[split_size];
         idx += tx_size_wide_unit[min_txs]) {
      const int index = (((blk_row + idy) >> tx_h_log2) << stride_log2) +
                        ((blk_col + idx) >> tx_w_log2);
      mbmi->inter_tx_size[index] = txs;
    }
  }
}